

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int64_suite::fail_array64_int64_invalid_length(void)

{
  value_type input [17];
  decoder decoder;
  undefined4 local_50;
  value local_4c;
  uchar local_48 [24];
  decoder local_30;
  
  local_30.input._M_str = local_48;
  local_48[0] = 0xde;
  local_48[1] = '\a';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\x11';
  local_48[10] = '\"';
  local_48[0xb] = '3';
  local_48[0xc] = 'D';
  local_48[0xd] = 'U';
  local_48[0xe] = 'f';
  local_48[0xf] = 'w';
  local_48[0x10] = 0x88;
  local_30.input._M_len = 0x11;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_4c = local_30.current.code;
  local_50 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc92,"void compact_int64_suite::fail_array64_int64_invalid_length()",&local_4c,
             &local_50);
  return;
}

Assistant:

void fail_array64_int64_invalid_length()
{
    const value_type input[] = { token::code::array64_int64, 0x07, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}